

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimstate.cpp
# Opt level: O1

int __thiscall BtorSimState::remove(BtorSimState *this,char *__filename)

{
  BtorSimArrayModel *this_00;
  Type extraout_EAX;
  Type extraout_EAX_00;
  Type TVar1;
  int extraout_EAX_01;
  
  TVar1 = this->type;
  if (TVar1 == BITVEC) {
    if ((this->field_1).bv_state != (BtorSimBitVector *)0x0) {
      btorsim_bv_free((this->field_1).bv_state);
      TVar1 = extraout_EAX_00;
    }
  }
  else {
    if (TVar1 != ARRAY) {
      die("Removing invalid state!");
      return extraout_EAX_01;
    }
    this_00 = (this->field_1).array_state;
    if (this_00 != (BtorSimArrayModel *)0x0) {
      BtorSimArrayModel::~BtorSimArrayModel(this_00);
      operator_delete(this_00);
      TVar1 = extraout_EAX;
    }
  }
  (this->field_1).bv_state = (BtorSimBitVector *)0x0;
  return TVar1;
}

Assistant:

void
BtorSimState::remove ()
{
  switch (type)
  {
    case ARRAY:
      if (array_state) delete array_state;
      array_state = nullptr;
      break;
    case BtorSimState::Type::BITVEC:
      if (bv_state) btorsim_bv_free (bv_state);
      bv_state = nullptr;
      break;
    default: die ("Removing invalid state!");
  }
}